

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>
          (RawUpdateRegistry *this,VkDescriptorImageInfo *updateObject)

{
  uchar *puVar1;
  deUint64 *pdVar2;
  VkDescriptorImageInfo *t;
  VkDescriptorImageInfo *updateObject_local;
  RawUpdateRegistry *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->m_updateEntryOffsets,&this->m_nextOffset);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_updateEntries,this->m_nextOffset + 0x18);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->m_updateEntries);
  pdVar2 = (deUint64 *)(puVar1 + this->m_nextOffset);
  *pdVar2 = (updateObject->sampler).m_internal;
  pdVar2[1] = (updateObject->imageView).m_internal;
  *(VkImageLayout *)(pdVar2 + 2) = updateObject->imageLayout;
  this->m_nextOffset = this->m_nextOffset + 0x18;
  return;
}

Assistant:

void RawUpdateRegistry::addWriteObject (const Type& updateObject)
{
	m_updateEntryOffsets.push_back(m_nextOffset);

	// in this case, elements <=> bytes
	m_updateEntries.resize(m_nextOffset + sizeof(updateObject));
	Type* t = reinterpret_cast<Type*>(m_updateEntries.data() + m_nextOffset);
	*t = updateObject;
	m_nextOffset += sizeof(updateObject);
}